

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

Permissions __thiscall QFileInfo::permissions(QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  uint uVar1;
  QFlagsStorage<QFileDevice::Permission> QVar2;
  
  this_00 = (this->d_ptr).d.ptr;
  QVar2.i = 0;
  if ((*(uint *)&this_00->field_0x1d8 >> 0x1e & 1) == 0) {
    if ((this_00->fileEngine)._M_t.
        super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
        super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
        super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      if ((-1 < (int)*(uint *)&this_00->field_0x1d8) ||
         ((~(this_00->metaData).knownFlagsMask.
            super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x7777) != 0)) {
        QFileSystemEngine::fillMetaData
                  (&this_00->fileEntry,&this_00->metaData,(MetaDataFlags)0x7777);
      }
      QVar2.i = (this_00->metaData).entryFlags.
                super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x7777;
    }
    else {
      uVar1 = QFileInfoPrivate::getFileFlags(this_00,(FileFlags)0xffff);
      QVar2.i = uVar1 & 0xffff;
    }
  }
  return (QFlagsStorageHelper<QFileDevice::Permission,_4>)
         (QFlagsStorageHelper<QFileDevice::Permission,_4>)QVar2.i;
}

Assistant:

constexpr P get() const noexcept { return ptr; }